

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Material>
          (Structure *this,Material *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  Material *dest_local;
  Structure *this_local;
  
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  ReadField<1,float>(this,&dest->r,"r",db);
  ReadField<1,float>(this,&dest->g,"g",db);
  ReadField<1,float>(this,&dest->b,"b",db);
  ReadField<1,float>(this,&dest->specr,"specr",db);
  ReadField<1,float>(this,&dest->specg,"specg",db);
  ReadField<1,float>(this,&dest->specb,"specb",db);
  ReadField<1,short>(this,&dest->har,"har",db);
  ReadField<1,float>(this,&dest->ambr,"ambr",db);
  ReadField<1,float>(this,&dest->ambg,"ambg",db);
  ReadField<1,float>(this,&dest->ambb,"ambb",db);
  ReadField<1,float>(this,&dest->mirr,"mirr",db);
  ReadField<1,float>(this,&dest->mirg,"mirg",db);
  ReadField<1,float>(this,&dest->mirb,"mirb",db);
  ReadField<1,float>(this,&dest->emit,"emit",db);
  ReadField<1,float>(this,&dest->ray_mirror,"ray_mirror",db);
  ReadField<1,float>(this,&dest->alpha,"alpha",db);
  ReadField<1,float>(this,&dest->ref,"ref",db);
  ReadField<1,float>(this,&dest->translucency,"translucency",db);
  ReadField<1,int>(this,&dest->mode,"mode",db);
  ReadField<1,float>(this,&dest->roughness,"roughness",db);
  ReadField<1,float>(this,&dest->darkness,"darkness",db);
  ReadField<1,float>(this,&dest->refrac,"refrac",db);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Group>(this,&dest->group,"*group",db,false);
  ReadField<1,short>(this,&dest->diff_shader,"diff_shader",db);
  ReadField<1,short>(this,&dest->spec_shader,"spec_shader",db);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::MTex,18ul>(this,&dest->mtex,"*mtex",db);
  ReadField<1,float>(this,&dest->amb,"amb",db);
  ReadField<1,float>(this,&dest->ang,"ang",db);
  ReadField<1,float>(this,&dest->spectra,"spectra",db);
  ReadField<1,float>(this,&dest->spec,"spec",db);
  ReadField<1,float>(this,&dest->zoffs,"zoffs",db);
  ReadField<1,float>(this,&dest->add,"add",db);
  ReadField<1,float>(this,&dest->fresnel_mir,"fresnel_mir",db);
  ReadField<1,float>(this,&dest->fresnel_mir_i,"fresnel_mir_i",db);
  ReadField<1,float>(this,&dest->fresnel_tra,"fresnel_tra",db);
  ReadField<1,float>(this,&dest->fresnel_tra_i,"fresnel_tra_i",db);
  ReadField<1,float>(this,&dest->filter,"filter",db);
  ReadField<1,float>(this,&dest->tx_limit,"tx_limit",db);
  ReadField<1,float>(this,&dest->tx_falloff,"tx_falloff",db);
  ReadField<1,float>(this,&dest->gloss_mir,"gloss_mir",db);
  ReadField<1,float>(this,&dest->gloss_tra,"gloss_tra",db);
  ReadField<1,float>(this,&dest->adapt_thresh_mir,"adapt_thresh_mir",db);
  ReadField<1,float>(this,&dest->adapt_thresh_tra,"adapt_thresh_tra",db);
  ReadField<1,float>(this,&dest->aniso_gloss_mir,"aniso_gloss_mir",db);
  ReadField<1,float>(this,&dest->dist_mir,"dist_mir",db);
  ReadField<1,float>(this,&dest->hasize,"hasize",db);
  ReadField<1,float>(this,&dest->flaresize,"flaresize",db);
  ReadField<1,float>(this,&dest->subsize,"subsize",db);
  ReadField<1,float>(this,&dest->flareboost,"flareboost",db);
  ReadField<1,float>(this,&dest->strand_sta,"strand_sta",db);
  ReadField<1,float>(this,&dest->strand_end,"strand_end",db);
  ReadField<1,float>(this,&dest->strand_ease,"strand_ease",db);
  ReadField<1,float>(this,&dest->strand_surfnor,"strand_surfnor",db);
  ReadField<1,float>(this,&dest->strand_min,"strand_min",db);
  ReadField<1,float>(this,&dest->strand_widthfade,"strand_widthfade",db);
  ReadField<1,float>(this,&dest->sbias,"sbias",db);
  ReadField<1,float>(this,&dest->lbias,"lbias",db);
  ReadField<1,float>(this,&dest->shad_alpha,"shad_alpha",db);
  ReadField<1,float>(this,&dest->param,"param",db);
  ReadField<1,float>(this,&dest->rms,"rms",db);
  ReadField<1,float>(this,&dest->rampfac_col,"rampfac_col",db);
  ReadField<1,float>(this,&dest->rampfac_spec,"rampfac_spec",db);
  ReadField<1,float>(this,&dest->friction,"friction",db);
  ReadField<1,float>(this,&dest->fh,"fh",db);
  ReadField<1,float>(this,&dest->reflect,"reflect",db);
  ReadField<1,float>(this,&dest->fhdist,"fhdist",db);
  ReadField<1,float>(this,&dest->xyfrict,"xyfrict",db);
  ReadField<1,float>(this,&dest->sss_radius,"sss_radius",db);
  ReadField<1,float>(this,&dest->sss_col,"sss_col",db);
  ReadField<1,float>(this,&dest->sss_error,"sss_error",db);
  ReadField<1,float>(this,&dest->sss_scale,"sss_scale",db);
  ReadField<1,float>(this,&dest->sss_ior,"sss_ior",db);
  ReadField<1,float>(this,&dest->sss_colfac,"sss_colfac",db);
  ReadField<1,float>(this,&dest->sss_texfac,"sss_texfac",db);
  ReadField<1,float>(this,&dest->sss_front,"sss_front",db);
  ReadField<1,float>(this,&dest->sss_back,"sss_back",db);
  ReadField<1,short>(this,&dest->material_type,"material_type",db);
  ReadField<1,short>(this,&dest->flag,"flag",db);
  ReadField<1,short>(this,&dest->ray_depth,"ray_depth",db);
  ReadField<1,short>(this,&dest->ray_depth_tra,"ray_depth_tra",db);
  ReadField<1,short>(this,&dest->samp_gloss_mir,"samp_gloss_mir",db);
  ReadField<1,short>(this,&dest->samp_gloss_tra,"samp_gloss_tra",db);
  ReadField<1,short>(this,&dest->fadeto_mir,"fadeto_mir",db);
  ReadField<1,short>(this,&dest->shade_flag,"shade_flag",db);
  ReadField<1,short>(this,&dest->flarec,"flarec",db);
  ReadField<1,short>(this,&dest->starc,"starc",db);
  ReadField<1,short>(this,&dest->linec,"linec",db);
  ReadField<1,short>(this,&dest->ringc,"ringc",db);
  ReadField<1,short>(this,&dest->pr_lamp,"pr_lamp",db);
  ReadField<1,short>(this,&dest->pr_texture,"pr_texture",db);
  ReadField<1,short>(this,&dest->ml_flag,"ml_flag",db);
  ReadField<1,short>(this,&dest->diff_shader,"diff_shader",db);
  ReadField<1,short>(this,&dest->spec_shader,"spec_shader",db);
  ReadField<1,short>(this,&dest->texco,"texco",db);
  ReadField<1,short>(this,&dest->mapto,"mapto",db);
  ReadField<1,short>(this,&dest->ramp_show,"ramp_show",db);
  ReadField<1,short>(this,&dest->pad3,"pad3",db);
  ReadField<1,short>(this,&dest->dynamode,"dynamode",db);
  ReadField<1,short>(this,&dest->pad2,"pad2",db);
  ReadField<1,short>(this,&dest->sss_flag,"sss_flag",db);
  ReadField<1,short>(this,&dest->sss_preset,"sss_preset",db);
  ReadField<1,short>(this,&dest->shadowonly_flag,"shadowonly_flag",db);
  ReadField<1,short>(this,&dest->index,"index",db);
  ReadField<1,short>(this,&dest->vcol_alpha,"vcol_alpha",db);
  ReadField<1,short>(this,&dest->pad4,"pad4",db);
  ReadField<1,char>(this,&dest->seed1,"seed1",db);
  ReadField<1,char>(this,&dest->seed2,"seed2",db);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<Material> (
    Material& dest,
    const FileDatabase& db
    ) const
{
    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    ReadField<ErrorPolicy_Warn>(dest.r,"r",db);
    ReadField<ErrorPolicy_Warn>(dest.g,"g",db);
    ReadField<ErrorPolicy_Warn>(dest.b,"b",db);
    ReadField<ErrorPolicy_Warn>(dest.specr,"specr",db);
    ReadField<ErrorPolicy_Warn>(dest.specg,"specg",db);
    ReadField<ErrorPolicy_Warn>(dest.specb,"specb",db);
    ReadField<ErrorPolicy_Igno>(dest.har,"har",db);
    ReadField<ErrorPolicy_Warn>(dest.ambr,"ambr",db);
    ReadField<ErrorPolicy_Warn>(dest.ambg,"ambg",db);
    ReadField<ErrorPolicy_Warn>(dest.ambb,"ambb",db);
    ReadField<ErrorPolicy_Igno>(dest.mirr,"mirr",db);
    ReadField<ErrorPolicy_Igno>(dest.mirg,"mirg",db);
    ReadField<ErrorPolicy_Igno>(dest.mirb,"mirb",db);
    ReadField<ErrorPolicy_Warn>(dest.emit,"emit",db);
    ReadField<ErrorPolicy_Igno>(dest.ray_mirror,"ray_mirror",db);
    ReadField<ErrorPolicy_Warn>(dest.alpha,"alpha",db);
    ReadField<ErrorPolicy_Igno>(dest.ref,"ref",db);
    ReadField<ErrorPolicy_Igno>(dest.translucency,"translucency",db);
    ReadField<ErrorPolicy_Igno>(dest.mode,"mode",db);
    ReadField<ErrorPolicy_Igno>(dest.roughness,"roughness",db);
    ReadField<ErrorPolicy_Igno>(dest.darkness,"darkness",db);
    ReadField<ErrorPolicy_Igno>(dest.refrac,"refrac",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.group,"*group",db);
    ReadField<ErrorPolicy_Warn>(dest.diff_shader,"diff_shader",db);
    ReadField<ErrorPolicy_Warn>(dest.spec_shader,"spec_shader",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.mtex,"*mtex",db);


    ReadField<ErrorPolicy_Igno>(dest.amb, "amb", db);
    ReadField<ErrorPolicy_Igno>(dest.ang, "ang", db);
    ReadField<ErrorPolicy_Igno>(dest.spectra, "spectra", db);
    ReadField<ErrorPolicy_Igno>(dest.spec, "spec", db);
    ReadField<ErrorPolicy_Igno>(dest.zoffs, "zoffs", db);
    ReadField<ErrorPolicy_Igno>(dest.add, "add", db);
    ReadField<ErrorPolicy_Igno>(dest.fresnel_mir, "fresnel_mir", db);
    ReadField<ErrorPolicy_Igno>(dest.fresnel_mir_i, "fresnel_mir_i", db);
    ReadField<ErrorPolicy_Igno>(dest.fresnel_tra, "fresnel_tra", db);
    ReadField<ErrorPolicy_Igno>(dest.fresnel_tra_i, "fresnel_tra_i", db);
    ReadField<ErrorPolicy_Igno>(dest.filter, "filter", db);
    ReadField<ErrorPolicy_Igno>(dest.tx_limit, "tx_limit", db);
    ReadField<ErrorPolicy_Igno>(dest.tx_falloff, "tx_falloff", db);
    ReadField<ErrorPolicy_Igno>(dest.gloss_mir, "gloss_mir", db);
    ReadField<ErrorPolicy_Igno>(dest.gloss_tra, "gloss_tra", db);
    ReadField<ErrorPolicy_Igno>(dest.adapt_thresh_mir, "adapt_thresh_mir", db);
    ReadField<ErrorPolicy_Igno>(dest.adapt_thresh_tra, "adapt_thresh_tra", db);
    ReadField<ErrorPolicy_Igno>(dest.aniso_gloss_mir, "aniso_gloss_mir", db);
    ReadField<ErrorPolicy_Igno>(dest.dist_mir, "dist_mir", db);
    ReadField<ErrorPolicy_Igno>(dest.hasize, "hasize", db);
    ReadField<ErrorPolicy_Igno>(dest.flaresize, "flaresize", db);
    ReadField<ErrorPolicy_Igno>(dest.subsize, "subsize", db);
    ReadField<ErrorPolicy_Igno>(dest.flareboost, "flareboost", db);
    ReadField<ErrorPolicy_Igno>(dest.strand_sta, "strand_sta", db);
    ReadField<ErrorPolicy_Igno>(dest.strand_end, "strand_end", db);
    ReadField<ErrorPolicy_Igno>(dest.strand_ease, "strand_ease", db);
    ReadField<ErrorPolicy_Igno>(dest.strand_surfnor, "strand_surfnor", db);
    ReadField<ErrorPolicy_Igno>(dest.strand_min, "strand_min", db);
    ReadField<ErrorPolicy_Igno>(dest.strand_widthfade, "strand_widthfade", db);
    ReadField<ErrorPolicy_Igno>(dest.sbias, "sbias", db);
    ReadField<ErrorPolicy_Igno>(dest.lbias, "lbias", db);
    ReadField<ErrorPolicy_Igno>(dest.shad_alpha, "shad_alpha", db);
    ReadField<ErrorPolicy_Igno>(dest.param, "param", db);
    ReadField<ErrorPolicy_Igno>(dest.rms, "rms", db);
    ReadField<ErrorPolicy_Igno>(dest.rampfac_col, "rampfac_col", db);
    ReadField<ErrorPolicy_Igno>(dest.rampfac_spec, "rampfac_spec", db);
    ReadField<ErrorPolicy_Igno>(dest.friction, "friction", db);
    ReadField<ErrorPolicy_Igno>(dest.fh, "fh", db);
    ReadField<ErrorPolicy_Igno>(dest.reflect, "reflect", db);
    ReadField<ErrorPolicy_Igno>(dest.fhdist, "fhdist", db);
    ReadField<ErrorPolicy_Igno>(dest.xyfrict, "xyfrict", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_radius, "sss_radius", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_col, "sss_col", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_error, "sss_error", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_scale, "sss_scale", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_ior, "sss_ior", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_colfac, "sss_colfac", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_texfac, "sss_texfac", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_front, "sss_front", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_back, "sss_back", db);

    ReadField<ErrorPolicy_Igno>(dest.material_type, "material_type", db);
    ReadField<ErrorPolicy_Igno>(dest.flag, "flag", db);
    ReadField<ErrorPolicy_Igno>(dest.ray_depth, "ray_depth", db);
    ReadField<ErrorPolicy_Igno>(dest.ray_depth_tra, "ray_depth_tra", db);
    ReadField<ErrorPolicy_Igno>(dest.samp_gloss_mir, "samp_gloss_mir", db);
    ReadField<ErrorPolicy_Igno>(dest.samp_gloss_tra, "samp_gloss_tra", db);
    ReadField<ErrorPolicy_Igno>(dest.fadeto_mir, "fadeto_mir", db);
    ReadField<ErrorPolicy_Igno>(dest.shade_flag, "shade_flag", db);
    ReadField<ErrorPolicy_Igno>(dest.flarec, "flarec", db);
    ReadField<ErrorPolicy_Igno>(dest.starc, "starc", db);
    ReadField<ErrorPolicy_Igno>(dest.linec, "linec", db);
    ReadField<ErrorPolicy_Igno>(dest.ringc, "ringc", db);
    ReadField<ErrorPolicy_Igno>(dest.pr_lamp, "pr_lamp", db);
    ReadField<ErrorPolicy_Igno>(dest.pr_texture, "pr_texture", db);
    ReadField<ErrorPolicy_Igno>(dest.ml_flag, "ml_flag", db);
    ReadField<ErrorPolicy_Igno>(dest.diff_shader, "diff_shader", db);
    ReadField<ErrorPolicy_Igno>(dest.spec_shader, "spec_shader", db);
    ReadField<ErrorPolicy_Igno>(dest.texco, "texco", db);
    ReadField<ErrorPolicy_Igno>(dest.mapto, "mapto", db);
    ReadField<ErrorPolicy_Igno>(dest.ramp_show, "ramp_show", db);
    ReadField<ErrorPolicy_Igno>(dest.pad3, "pad3", db);
    ReadField<ErrorPolicy_Igno>(dest.dynamode, "dynamode", db);
    ReadField<ErrorPolicy_Igno>(dest.pad2, "pad2", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_flag, "sss_flag", db);
    ReadField<ErrorPolicy_Igno>(dest.sss_preset, "sss_preset", db);
    ReadField<ErrorPolicy_Igno>(dest.shadowonly_flag, "shadowonly_flag", db);
    ReadField<ErrorPolicy_Igno>(dest.index, "index", db);
    ReadField<ErrorPolicy_Igno>(dest.vcol_alpha, "vcol_alpha", db);
    ReadField<ErrorPolicy_Igno>(dest.pad4, "pad4", db);

    ReadField<ErrorPolicy_Igno>(dest.seed1, "seed1", db);
    ReadField<ErrorPolicy_Igno>(dest.seed2, "seed2", db);

    db.reader->IncPtr(size);
}